

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master_link.cpp
# Opt level: O3

bool __thiscall
miniros::MasterLink::getParamNames
          (MasterLink *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *keys)

{
  pointer pcVar1;
  Error EVar2;
  int iVar3;
  string *value;
  XmlRpcValue *pXVar4;
  long lVar5;
  bool bVar6;
  int i;
  long lVar7;
  RpcValue result;
  RpcValue params;
  RpcValue parameters;
  RpcValue payload;
  string local_98;
  RpcValue local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_68;
  XmlRpcValue local_60;
  XmlRpcValue local_50;
  RpcValue local_40;
  
  local_60._type = TypeInvalid;
  local_60._value.asDouble = 0.0;
  local_78._type = TypeInvalid;
  local_78._value.asDouble = 0.0;
  local_40._type = TypeInvalid;
  local_40._value.asDouble = 0.0;
  local_68 = keys;
  value = this_node::getName_abi_cxx11_();
  XmlRpc::XmlRpcValue::XmlRpcValue((XmlRpcValue *)&local_98,value);
  pXVar4 = XmlRpc::XmlRpcValue::operator[](&local_60,0);
  XmlRpc::XmlRpcValue::operator=(pXVar4,(XmlRpcValue *)&local_98);
  XmlRpc::XmlRpcValue::invalidate((XmlRpcValue *)&local_98);
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"getParamNames","");
  EVar2 = execute(this,&local_98,&local_60,&local_78,&local_40,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  bVar6 = false;
  if ((EVar2.code == Ok) && (bVar6 = false, local_78._type == TypeArray)) {
    iVar3 = XmlRpc::XmlRpcValue::size(&local_78);
    if (iVar3 == 3) {
      pXVar4 = XmlRpc::XmlRpcValue::operator[](&local_78,2);
      local_50._type = TypeInvalid;
      XmlRpc::XmlRpcValue::operator=(&local_50,pXVar4);
      iVar3 = XmlRpc::XmlRpcValue::size(&local_50);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::resize(local_68,(long)iVar3);
      lVar5 = 0;
      lVar7 = 0;
      while( true ) {
        iVar3 = XmlRpc::XmlRpcValue::size(&local_50);
        bVar6 = iVar3 <= lVar7;
        if (iVar3 <= lVar7) break;
        pXVar4 = XmlRpc::XmlRpcValue::operator[](&local_50,(int)lVar7);
        if (pXVar4->_type != TypeString) break;
        pXVar4 = XmlRpc::XmlRpcValue::operator[](&local_50,(int)lVar7);
        XmlRpc::XmlRpcValue::assertTypeOrInvalid(pXVar4,TypeString);
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        pcVar1 = (((pXVar4->_value).asBinary)->super__Vector_base<char,_std::allocator<char>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_98,pcVar1,
                   (((pXVar4->_value).asBinary)->super__Vector_base<char,_std::allocator<char>_>).
                   _M_impl.super__Vector_impl_data._M_finish + (long)pcVar1);
        std::__cxx11::string::operator=
                  ((string *)
                   ((long)&(((local_68->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar5)
                   ,(string *)&local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        lVar7 = lVar7 + 1;
        lVar5 = lVar5 + 0x20;
      }
      XmlRpc::XmlRpcValue::invalidate(&local_50);
    }
    else {
      bVar6 = false;
    }
  }
  XmlRpc::XmlRpcValue::invalidate(&local_40);
  XmlRpc::XmlRpcValue::invalidate(&local_78);
  XmlRpc::XmlRpcValue::invalidate(&local_60);
  return bVar6;
}

Assistant:

bool MasterLink::getParamNames(std::vector<std::string>& keys)
{
  RpcValue params, result, payload;
  params[0] = this_node::getName();
  if (!this->execute("getParamNames", params, result, payload, false)) {
    return false;
  }
  // Make sure it's an array type
  if (result.getType() != RpcValue::TypeArray) {
    return false;
  }
  // Make sure it returned 3 elements
  if (result.size() != 3) {
    return false;
  }
  // Get the actual parameter keys
  RpcValue parameters = result[2];
  // Resize the output
  keys.resize(parameters.size());

  // Fill the output vector with the answer
  for (int i = 0; i < parameters.size(); ++i) {
    if (parameters[i].getType() != RpcValue::TypeString) {
      return false;
    }
    keys[i] = std::string(parameters[i]);
  }
  return true;
}